

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O3

void __thiscall
option::PrintUsageImplementation::LineWrapper::output
          (LineWrapper *this,IStringWriter *write,char *data,int len)

{
  int iVar1;
  
  iVar1 = this->head;
  if (this->tail == iVar1) {
    write_one_line(this,write);
    iVar1 = this->head;
  }
  this->lenbuf[iVar1] = len;
  iVar1 = this->head;
  this->datbuf[iVar1] = data;
  this->head = iVar1 + 1U & 0xf;
  return;
}

Assistant:

void output(IStringWriter& write, const char* data, int len)
    {
      if (buf_full())
        write_one_line(write);

      buf_store(data, len);
    }